

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ossl_sha256sum(uchar *tmp,size_t tmplen,uchar *sha256sum,size_t unused)

{
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  uint len;
  uint local_2c;
  
  local_2c = 0;
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  type = EVP_sha256();
  EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
  EVP_DigestUpdate(ctx,tmp,tmplen);
  EVP_DigestFinal_ex(ctx,sha256sum,&local_2c);
  EVP_MD_CTX_free(ctx);
  return CURLE_OK;
}

Assistant:

static CURLcode Curl_ossl_sha256sum(const unsigned char *tmp, /* input */
                                size_t tmplen,
                                unsigned char *sha256sum /* output */,
                                size_t unused)
{
  EVP_MD_CTX *mdctx;
  unsigned int len = 0;
  (void) unused;

  mdctx =  EVP_MD_CTX_create();
  EVP_DigestInit_ex(mdctx, EVP_sha256(), NULL);
  EVP_DigestUpdate(mdctx, tmp, tmplen);
  EVP_DigestFinal_ex(mdctx, sha256sum, &len);
  EVP_MD_CTX_destroy(mdctx);
  return CURLE_OK;
}